

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

void * __thiscall asmjit::ZoneHeap::_alloc(ZoneHeap *this,size_t size,size_t *allocatedSize)

{
  undefined8 *puVar1;
  bool bVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  undefined8 *puVar5;
  ulong *in_RDX;
  ulong in_RSI;
  long *in_RDI;
  DynamicBlock *next;
  DynamicBlock *block;
  void *p_1;
  size_t overhead;
  uint32_t distSlot;
  size_t distSize;
  size_t remain;
  Zone *zone;
  uint8_t *p;
  uint32_t slot;
  char *in_stack_000002a0;
  int in_stack_000002ac;
  char *in_stack_000002b0;
  ulong local_128;
  size_t in_stack_fffffffffffffef8;
  Zone *in_stack_ffffffffffffff00;
  unsigned_long local_f0;
  unsigned_long local_e8;
  ulong local_e0;
  ulong *local_d8;
  long *local_d0;
  uint local_c4;
  ulong *local_c0;
  ulong local_b8;
  long *local_a8;
  size_t local_a0;
  uint *local_88;
  char local_75;
  undefined4 local_64;
  ulong local_60;
  ulong *local_58;
  ulong *local_50;
  ulong *local_48;
  long *local_40;
  ulong *local_38;
  ulong local_30;
  ulong *local_28;
  undefined4 local_1c;
  undefined4 local_c;
  
  if (*in_RDI == 0) {
    DebugUtils::assertionFailed(in_stack_000002b0,in_stack_000002ac,in_stack_000002a0);
  }
  local_88 = &local_c4;
  if (in_RSI == 0) {
    DebugUtils::assertionFailed(in_stack_000002b0,in_stack_000002ac,in_stack_000002a0);
  }
  if (in_RSI < 0x201) {
    if (in_RSI < 0x81) {
      local_c4 = (uint)(in_RSI - 1 >> 5);
      local_1c = 0x20;
      *in_RDX = in_RSI + 0x1f & 0xffffffffffffffe0;
    }
    else {
      local_c4 = (int)(in_RSI - 0x81 >> 6) + 4;
      local_c = 0x40;
      *in_RDX = in_RSI + 0x3f & 0xffffffffffffffc0;
    }
    local_75 = '\x01';
  }
  else {
    local_75 = '\0';
  }
  local_c0 = in_RDX;
  if (local_75 == '\0') {
    if (-in_RSI - 1 < 0x39) {
      local_a8 = (long *)0x0;
    }
    else {
      local_a0 = in_RSI + 0x38;
      local_b8 = in_RSI;
      puVar5 = (undefined8 *)malloc(local_a0);
      if (puVar5 == (undefined8 *)0x0) {
        *local_c0 = 0;
        local_a8 = (long *)0x0;
      }
      else {
        puVar1 = (undefined8 *)in_RDI[0xb];
        if (puVar1 != (undefined8 *)0x0) {
          *puVar1 = puVar5;
        }
        *puVar5 = 0;
        puVar5[1] = puVar1;
        in_RDI[0xb] = (long)puVar5;
        local_a8 = (long *)((long)puVar5 + 0x37U & 0xffffffffffffffe0);
        local_a8[-1] = (long)puVar5;
        *local_c0 = local_b8;
      }
    }
  }
  else {
    local_a8 = (long *)in_RDI[(ulong)local_c4 + 1];
    local_b8 = *in_RDX;
    if (local_a8 == (long *)0x0) {
      local_d8 = (ulong *)*in_RDI;
      local_60 = *local_d8;
      local_64 = 0x20;
      local_d0 = (long *)(local_60 + 0x1f & 0xffffffffffffffe0);
      if ((long *)local_d8[1] < local_d0) {
        local_128 = 0;
      }
      else {
        local_128 = local_d8[1] - (long)local_d0;
        local_50 = local_d8;
      }
      local_e0 = local_128;
      local_58 = local_d8;
      local_48 = local_d8;
      if (local_128 < local_b8) {
        if (0x1f < local_128) {
          do {
            local_f0 = 0x80;
            puVar3 = std::min<unsigned_long>(&local_e0,&local_f0);
            local_e8 = *puVar3;
            uVar4 = local_e8 - 0x20 >> 5;
            if (3 < (uint)uVar4) {
              DebugUtils::assertionFailed(in_stack_000002b0,in_stack_000002ac,in_stack_000002a0);
            }
            *local_d0 = in_RDI[(uVar4 & 0xffffffff) + 1];
            in_RDI[(uVar4 & 0xffffffff) + 1] = (long)local_d0;
            local_d0 = (long *)(local_e8 + (long)local_d0);
            local_e0 = local_e0 - local_e8;
          } while (0x1f < local_e0);
          local_38 = local_d8;
          bVar2 = false;
          if ((long *)*local_d8 <= local_d0) {
            bVar2 = local_d0 <= (long *)local_d8[1];
          }
          local_40 = local_d0;
          if (!bVar2) {
            DebugUtils::assertionFailed(in_stack_000002b0,in_stack_000002ac,in_stack_000002a0);
          }
          *local_d8 = (ulong)local_d0;
        }
        local_a8 = (long *)Zone::_alloc(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        if (local_a8 == (long *)0x0) {
          *local_c0 = 0;
          local_a8 = (long *)0x0;
        }
      }
      else {
        local_30 = (long)local_d0 + local_b8;
        bVar2 = false;
        if (*local_d8 <= local_30) {
          bVar2 = local_30 <= local_d8[1];
        }
        if (!bVar2) {
          local_28 = local_d8;
          DebugUtils::assertionFailed(in_stack_000002b0,in_stack_000002ac,in_stack_000002a0);
        }
        *local_d8 = local_30;
        local_a8 = local_d0;
      }
    }
    else {
      in_RDI[(ulong)local_c4 + 1] = *local_a8;
    }
  }
  return local_a8;
}

Assistant:

void* ZoneHeap::_alloc(size_t size, size_t& allocatedSize) noexcept {
  ASMJIT_ASSERT(isInitialized());

  // We use our memory pool only if the requested block is of a reasonable size.
  uint32_t slot;
  if (_getSlotIndex(size, slot, allocatedSize)) {
    // Slot reuse.
    uint8_t* p = reinterpret_cast<uint8_t*>(_slots[slot]);
    size = allocatedSize;

    if (p) {
      _slots[slot] = reinterpret_cast<Slot*>(p)->next;
      //printf("ALLOCATED %p of size %d (SLOT %d)\n", p, int(size), slot);
      return p;
    }

    // So use Zone to allocate a new chunk for us. But before we use it, we
    // check if there is enough room for the new chunk in zone, and if not,
    // we redistribute the remaining memory in Zone's current block into slots.
    Zone* zone = _zone;
    p = Utils::alignTo(zone->getCursor(), kBlockAlignment);
    size_t remain = (p <= zone->getEnd()) ? (size_t)(zone->getEnd() - p) : size_t(0);

    if (ASMJIT_LIKELY(remain >= size)) {
      zone->setCursor(p + size);
      //printf("ALLOCATED %p of size %d (SLOT %d)\n", p, int(size), slot);
      return p;
    }
    else {
      // Distribute the remaining memory to suitable slots.
      if (remain >= kLoGranularity) {
        do {
          size_t distSize = std::min<size_t>(remain, kLoMaxSize);
          uint32_t distSlot = static_cast<uint32_t>((distSize - kLoGranularity) / kLoGranularity);
          ASMJIT_ASSERT(distSlot < kLoCount);

          reinterpret_cast<Slot*>(p)->next = _slots[distSlot];
          _slots[distSlot] = reinterpret_cast<Slot*>(p);

          p += distSize;
          remain -= distSize;
        } while (remain >= kLoGranularity);
        zone->setCursor(p);
      }

      p = static_cast<uint8_t*>(zone->_alloc(size));
      if (ASMJIT_UNLIKELY(!p)) {
        allocatedSize = 0;
        return nullptr;
      }

      //printf("ALLOCATED %p of size %d (SLOT %d)\n", p, int(size), slot);
      return p;
    }
  }
  else {
    // Allocate a dynamic block.
    size_t overhead = sizeof(DynamicBlock) + sizeof(DynamicBlock*) + kBlockAlignment;

    // Handle a possible overflow.
    if (ASMJIT_UNLIKELY(overhead >= ~static_cast<size_t>(0) - size))
      return nullptr;

    void* p = Internal::allocMemory(size + overhead);
    if (ASMJIT_UNLIKELY(!p)) {
      allocatedSize = 0;
      return nullptr;
    }

    // Link as first in `_dynamicBlocks` double-linked list.
    DynamicBlock* block = static_cast<DynamicBlock*>(p);
    DynamicBlock* next = _dynamicBlocks;

    if (next)
      next->prev = block;

    block->prev = nullptr;
    block->next = next;
    _dynamicBlocks = block;

    // Align the pointer to the guaranteed alignment and store `DynamicBlock`
    // at the end of the memory block, so `_releaseDynamic()` can find it.
    p = Utils::alignTo(static_cast<uint8_t*>(p) + sizeof(DynamicBlock) + sizeof(DynamicBlock*), kBlockAlignment);
    reinterpret_cast<DynamicBlock**>(p)[-1] = block;

    allocatedSize = size;
    //printf("ALLOCATED DYNAMIC %p of size %d\n", p, int(size));
    return p;
  }
}